

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

void __thiscall olc::PixelGameEngine::olc_ConstructFontSheet(PixelGameEngine *this)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  Sprite *pSVar5;
  char *pcVar6;
  Decal *this_00;
  v2d_generic<int> local_f4;
  byte local_e9;
  const_iterator pvStack_e8;
  value_type_conflict2 c;
  const_iterator __end1;
  const_iterator __begin1;
  array<unsigned_char,_96UL> *__range1;
  array<unsigned_char,_96UL> vSpacing;
  uint local_68;
  int k;
  int i;
  uint32_t r;
  uint32_t sym4;
  uint32_t sym3;
  uint32_t sym2;
  uint32_t sym1;
  size_t b;
  int local_40;
  int py;
  int px;
  string local_30 [8];
  string data;
  PixelGameEngine *this_local;
  
  data.field_2._8_8_ = this;
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::operator+=
            (local_30,"?Q`0001oOch0o01o@F40o0<AGD4090LAGD<090@A7ch0?00O7Q`0600>00000000");
  std::__cxx11::string::operator+=
            (local_30,"O000000nOT0063Qo4d8>?7a14Gno94AA4gno94AaOT0>o3`oO400o7QN00000400");
  std::__cxx11::string::operator+=
            (local_30,"Of80001oOg<7O7moBGT7O7lABET024@aBEd714AiOdl717a_=TH013Q>00000000");
  std::__cxx11::string::operator+=
            (local_30,"720D000V?V5oB3Q_HdUoE7a9@DdDE4A9@DmoE4A;Hg]oM4Aj8S4D84@`00000000");
  std::__cxx11::string::operator+=
            (local_30,"OaPT1000Oa`^13P1@AI[?g`1@A=[OdAoHgljA4Ao?WlBA7l1710007l100000000");
  std::__cxx11::string::operator+=
            (local_30,"ObM6000oOfMV?3QoBDD`O7a0BDDH@5A0BDD<@5A0BGeVO5ao@CQR?5Po00000000");
  std::__cxx11::string::operator+=
            (local_30,"Oc``000?Ogij70PO2D]??0Ph2DUM@7i`2DTg@7lh2GUj?0TO0C1870T?00000000");
  std::__cxx11::string::operator+=
            (local_30,"70<4001o?P<7?1QoHg43O;`h@GT0@:@LB@d0>:@hN@L0@?aoN@<0O7ao0000?000");
  std::__cxx11::string::operator+=
            (local_30,"OcH0001SOglLA7mg24TnK7ln24US>0PL24U140PnOgl0>7QgOcH0K71S0000A000");
  std::__cxx11::string::operator+=
            (local_30,"00H00000@Dm1S007@DUSg00?OdTnH7YhOfTL<7Yh@Cl0700?@Ah0300700000000");
  std::__cxx11::string::operator+=
            (local_30,"<008001QL00ZA41a@6HnI<1i@FHLM81M@@0LG81?O`0nC?Y7?`0ZA7Y300080000");
  std::__cxx11::string::operator+=
            (local_30,"O`082000Oh0827mo6>Hn?Wmo?6HnMb11MP08@C11H`08@FP0@@0004@000000000");
  std::__cxx11::string::operator+=
            (local_30,"00P00001Oab00003OcKP0006@6=PMgl<@440MglH@000000`@000001P00000000");
  std::__cxx11::string::operator+=
            (local_30,"Ob@8@@00Ob@8@Ga13R@8Mga172@8?PAo3R@827QoOb@820@0O`0007`0000007P0");
  std::__cxx11::string::operator+=
            (local_30,"O`000P08Od400g`<3V=P0G`673IP0`@3>1`00P@6O`P00g`<O`000GP800000000");
  std::__cxx11::string::operator+=
            (local_30,"?P9PL020O`<`N3R0@E4HC7b0@ET<ATB0@@l6C4B0O`H3N7b0?P01L3R000000020");
  pSVar5 = (Sprite *)operator_new(0x18);
  Sprite::Sprite(pSVar5,0x80,0x30);
  this->fontSprite = pSVar5;
  local_40 = 0;
  b._4_4_ = 0;
  for (_sym2 = 0; _sym2 < 0x400; _sym2 = _sym2 + 4) {
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_30);
    cVar1 = *pcVar6;
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_30);
    cVar2 = *pcVar6;
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_30);
    cVar3 = *pcVar6;
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_30);
    cVar4 = *pcVar6;
    for (local_68 = 0; (int)local_68 < 0x18; local_68 = local_68 + 1) {
      vSpacing._M_elems[0x5c] = '\0';
      vSpacing._M_elems[0x5d] = '\0';
      vSpacing._M_elems[0x5e] = '\0';
      vSpacing._M_elems[0x5f] = '\0';
      if ((((cVar1 + -0x30) * 0x40000 | (cVar2 + -0x30) * 0x1000 | (cVar3 + -0x30) * 0x40 |
           (int)cVar4 - 0x30U) >> (local_68 & 0x1f) & 1) != 0) {
        vSpacing._M_elems[0x5c] = 0xff;
        vSpacing._M_elems[0x5d] = '\0';
        vSpacing._M_elems[0x5e] = '\0';
        vSpacing._M_elems[0x5f] = '\0';
      }
      pSVar5 = this->fontSprite;
      Pixel::Pixel((Pixel *)(vSpacing._M_elems + 0x58),vSpacing._M_elems[0x5c],
                   vSpacing._M_elems[0x5c],vSpacing._M_elems[0x5c],vSpacing._M_elems[0x5c]);
      Sprite::SetPixel(pSVar5,local_40,b._4_4_,(Pixel)vSpacing._M_elems._88_4_);
      b._4_4_ = b._4_4_ + 1;
      if (b._4_4_ == 0x30) {
        local_40 = local_40 + 1;
        b._4_4_ = 0;
      }
    }
  }
  this_00 = (Decal *)operator_new(0x20);
  Decal::Decal(this_00,this->fontSprite,false);
  this->fontDecal = this_00;
  memcpy(&__range1,&DAT_00173806,0x60);
  __begin1 = (const_iterator)&__range1;
  __end1 = std::array<unsigned_char,_96UL>::begin((array<unsigned_char,_96UL> *)__begin1);
  pvStack_e8 = std::array<unsigned_char,_96UL>::end((array<unsigned_char,_96UL> *)__begin1);
  for (; __end1 != pvStack_e8; __end1 = __end1 + 1) {
    local_e9 = *__end1;
    v2d_generic<int>::v2d_generic(&local_f4,(uint)(local_e9 >> 4),local_e9 & 0xf);
    std::vector<olc::v2d_generic<int>,_std::allocator<olc::v2d_generic<int>_>_>::push_back
              (&this->vFontSpacing,&local_f4);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void PixelGameEngine::olc_ConstructFontSheet()
	{
		std::string data;
		data += "?Q`0001oOch0o01o@F40o0<AGD4090LAGD<090@A7ch0?00O7Q`0600>00000000";
		data += "O000000nOT0063Qo4d8>?7a14Gno94AA4gno94AaOT0>o3`oO400o7QN00000400";
		data += "Of80001oOg<7O7moBGT7O7lABET024@aBEd714AiOdl717a_=TH013Q>00000000";
		data += "720D000V?V5oB3Q_HdUoE7a9@DdDE4A9@DmoE4A;Hg]oM4Aj8S4D84@`00000000";
		data += "OaPT1000Oa`^13P1@AI[?g`1@A=[OdAoHgljA4Ao?WlBA7l1710007l100000000";
		data += "ObM6000oOfMV?3QoBDD`O7a0BDDH@5A0BDD<@5A0BGeVO5ao@CQR?5Po00000000";
		data += "Oc``000?Ogij70PO2D]??0Ph2DUM@7i`2DTg@7lh2GUj?0TO0C1870T?00000000";
		data += "70<4001o?P<7?1QoHg43O;`h@GT0@:@LB@d0>:@hN@L0@?aoN@<0O7ao0000?000";
		data += "OcH0001SOglLA7mg24TnK7ln24US>0PL24U140PnOgl0>7QgOcH0K71S0000A000";
		data += "00H00000@Dm1S007@DUSg00?OdTnH7YhOfTL<7Yh@Cl0700?@Ah0300700000000";
		data += "<008001QL00ZA41a@6HnI<1i@FHLM81M@@0LG81?O`0nC?Y7?`0ZA7Y300080000";
		data += "O`082000Oh0827mo6>Hn?Wmo?6HnMb11MP08@C11H`08@FP0@@0004@000000000";
		data += "00P00001Oab00003OcKP0006@6=PMgl<@440MglH@000000`@000001P00000000";
		data += "Ob@8@@00Ob@8@Ga13R@8Mga172@8?PAo3R@827QoOb@820@0O`0007`0000007P0";
		data += "O`000P08Od400g`<3V=P0G`673IP0`@3>1`00P@6O`P00g`<O`000GP800000000";
		data += "?P9PL020O`<`N3R0@E4HC7b0@ET<ATB0@@l6C4B0O`H3N7b0?P01L3R000000020";

		fontSprite = new olc::Sprite(128, 48);
		int px = 0, py = 0;
		for (size_t b = 0; b < 1024; b += 4)
		{
			uint32_t sym1 = (uint32_t)data[b + 0] - 48;
			uint32_t sym2 = (uint32_t)data[b + 1] - 48;
			uint32_t sym3 = (uint32_t)data[b + 2] - 48;
			uint32_t sym4 = (uint32_t)data[b + 3] - 48;
			uint32_t r = sym1 << 18 | sym2 << 12 | sym3 << 6 | sym4;

			for (int i = 0; i < 24; i++)
			{
				int k = r & (1 << i) ? 255 : 0;
				fontSprite->SetPixel(px, py, olc::Pixel(k, k, k, k));
				if (++py == 48)
				{
					px++;
					py = 0;
				}
			}
		}

		fontDecal = new olc::Decal(fontSprite);

		constexpr std::array<uint8_t, 96> vSpacing = {{
			0x03,
			0x25,
			0x16,
			0x08,
			0x07,
			0x08,
			0x08,
			0x04,
			0x15,
			0x15,
			0x08,
			0x07,
			0x15,
			0x07,
			0x24,
			0x08,
			0x08,
			0x17,
			0x08,
			0x08,
			0x08,
			0x08,
			0x08,
			0x08,
			0x08,
			0x08,
			0x24,
			0x15,
			0x06,
			0x07,
			0x16,
			0x17,
			0x08,
			0x08,
			0x08,
			0x08,
			0x08,
			0x08,
			0x08,
			0x08,
			0x08,
			0x17,
			0x08,
			0x08,
			0x17,
			0x08,
			0x08,
			0x08,
			0x08,
			0x08,
			0x08,
			0x08,
			0x17,
			0x08,
			0x08,
			0x08,
			0x08,
			0x17,
			0x08,
			0x15,
			0x08,
			0x15,
			0x08,
			0x08,
			0x24,
			0x18,
			0x17,
			0x17,
			0x17,
			0x17,
			0x17,
			0x17,
			0x17,
			0x33,
			0x17,
			0x17,
			0x33,
			0x18,
			0x17,
			0x17,
			0x17,
			0x17,
			0x17,
			0x17,
			0x07,
			0x17,
			0x17,
			0x18,
			0x18,
			0x17,
			0x17,
			0x07,
			0x33,
			0x07,
			0x08,
			0x00,
		}};

		for (auto c : vSpacing)
			vFontSpacing.push_back({c >> 4, c & 15});
	}